

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O3

void glmc_rotate(vec4 *m,float angle,float *axis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  fVar6 = cosf(angle);
  fVar7 = *axis;
  fVar8 = axis[1];
  fVar9 = axis[2];
  fVar19 = SQRT(fVar9 * fVar9 + fVar7 * fVar7 + fVar8 * fVar8);
  fVar13 = 1.0 / fVar19;
  fVar16 = 0.0;
  fVar15 = 0.0;
  if (1.1920929e-07 <= fVar19) {
    fVar16 = fVar7 * fVar13;
    fVar15 = fVar8 * fVar13;
  }
  fVar19 = (float)(~-(uint)(fVar19 < 1.1920929e-07) & (uint)(fVar9 * fVar13));
  fVar13 = 1.0 - fVar6;
  fVar7 = fVar13 * fVar16;
  fVar8 = fVar13 * fVar15;
  fVar13 = fVar13 * fVar19;
  fVar9 = sinf(angle);
  fVar12 = fVar16 * fVar7 + fVar6;
  fVar14 = fVar16 * fVar8 - fVar9 * fVar19;
  fVar20 = fVar16 * fVar13 + fVar15 * fVar9;
  fVar10 = fVar15 * fVar7 + fVar9 * fVar19;
  fVar11 = fVar15 * fVar8 + fVar6;
  fVar21 = fVar15 * fVar13 - fVar16 * fVar9;
  fVar17 = fVar7 * fVar19 - fVar15 * fVar9;
  fVar18 = fVar8 * fVar19 + fVar16 * fVar9;
  fVar6 = fVar13 * fVar19 + fVar6;
  fVar7 = (*m)[0];
  fVar8 = (*m)[1];
  fVar9 = (*m)[2];
  fVar16 = (*m)[3];
  fVar15 = m[1][0];
  fVar13 = m[1][1];
  fVar19 = m[1][2];
  fVar1 = m[1][3];
  fVar2 = m[2][0];
  fVar3 = m[2][1];
  fVar4 = m[2][2];
  fVar5 = m[2][3];
  (*m)[0] = fVar17 * fVar2 + fVar10 * fVar15 + fVar12 * fVar7;
  (*m)[1] = fVar17 * fVar3 + fVar10 * fVar13 + fVar12 * fVar8;
  (*m)[2] = fVar17 * fVar4 + fVar10 * fVar19 + fVar12 * fVar9;
  (*m)[3] = fVar17 * fVar5 + fVar10 * fVar1 + fVar12 * fVar16;
  m[1][0] = fVar18 * fVar2 + fVar11 * fVar15 + fVar14 * fVar7;
  m[1][1] = fVar18 * fVar3 + fVar11 * fVar13 + fVar14 * fVar8;
  m[1][2] = fVar18 * fVar4 + fVar11 * fVar19 + fVar14 * fVar9;
  m[1][3] = fVar18 * fVar5 + fVar11 * fVar1 + fVar14 * fVar16;
  m[2][0] = fVar6 * fVar2 + fVar21 * fVar15 + fVar20 * fVar7;
  m[2][1] = fVar6 * fVar3 + fVar21 * fVar13 + fVar20 * fVar8;
  m[2][2] = fVar6 * fVar4 + fVar21 * fVar19 + fVar20 * fVar9;
  m[2][3] = fVar6 * fVar5 + fVar21 * fVar1 + fVar20 * fVar16;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_rotate(mat4 m, float angle, vec3 axis) {
  glm_rotate(m, angle, axis);
}